

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-devurandom.c
# Opt level: O3

int uv__random_readpath(char *path,void *buf,size_t buflen)

{
  int __fd;
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  size_t sVar4;
  stat s;
  stat64 local_c0;
  
  __fd = uv__open_cloexec(path,0);
  if (-1 < __fd) {
    iVar1 = fstat64(__fd,&local_c0);
    if (iVar1 == 0) {
      if ((local_c0.st_mode & 0xf000) == 0x2000) {
        if (buflen != 0) {
          sVar4 = 0;
          do {
            while (sVar3 = read(__fd,(void *)((long)buf + sVar4),buflen - sVar4), sVar3 == -1) {
              piVar2 = __errno_location();
              if (*piVar2 != 4) {
                uv__close(__fd);
                return -*piVar2;
              }
            }
            if (sVar3 == 0) goto LAB_00113da9;
            sVar4 = sVar4 + sVar3;
          } while (sVar4 != buflen);
        }
        uv__close(__fd);
        __fd = 0;
      }
      else {
LAB_00113da9:
        uv__close(__fd);
        __fd = -5;
      }
    }
    else {
      uv__close(__fd);
      piVar2 = __errno_location();
      __fd = -*piVar2;
    }
  }
  return __fd;
}

Assistant:

int uv__random_readpath(const char* path, void* buf, size_t buflen) {
  struct stat s;
  size_t pos;
  ssize_t n;
  int fd;

  fd = uv__open_cloexec(path, O_RDONLY);

  if (fd < 0)
    return fd;

  if (fstat(fd, &s)) {
    uv__close(fd);
    return UV__ERR(errno);
  }

  if (!S_ISCHR(s.st_mode)) {
    uv__close(fd);
    return UV_EIO;
  }

  for (pos = 0; pos != buflen; pos += n) {
    do
      n = read(fd, (char*) buf + pos, buflen - pos);
    while (n == -1 && errno == EINTR);

    if (n == -1) {
      uv__close(fd);
      return UV__ERR(errno);
    }

    if (n == 0) {
      uv__close(fd);
      return UV_EIO;
    }
  }

  uv__close(fd);
  return 0;
}